

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

int __thiscall nite::Batch::init(Batch *this,EVP_PKEY_CTX *ctx)

{
  float *pfVar1;
  PFNGLBINDFRAMEBUFFERPROC p_Var2;
  PFNGLFRAMEBUFFERTEXTURE2DPROC p_Var3;
  PFNGLGENFRAMEBUFFERSPROC p_Var4;
  int iVar5;
  GLuint GVar6;
  reference pvVar7;
  int in_EDX;
  Batch *local_20;
  int local_18;
  int local_14;
  int h_local;
  int w_local;
  Batch *this_local;
  
  local_14 = (int)ctx;
  local_18 = in_EDX;
  _h_local = this;
  if (-1 < this->objectId) {
    if (((float)local_14 == (this->size).x) && (!NAN((float)local_14) && !NAN((this->size).x))) {
      pfVar1 = &(this->size).y;
      if (((float)in_EDX == *pfVar1) && (!NAN((float)in_EDX) && !NAN(*pfVar1))) goto LAB_001fcc8d;
    }
    unload(this);
  }
  iVar5 = getEmptySlot();
  this->objectId = iVar5;
  pvVar7 = std::vector<BatchT,_std::allocator<BatchT>_>::operator[](&batches,(long)this->objectId);
  local_20 = this;
  std::vector<nite::Batch_*,_std::allocator<nite::Batch_*>_>::push_back(&pvVar7->owners,&local_20);
  pvVar7 = std::vector<BatchT,_std::allocator<BatchT>_>::operator[](&batches,(long)this->objectId);
  pvVar7->empty = false;
  Vec2::set(&this->size,(float)local_14,(float)local_18);
  Rect::set(&this->region,0.0,0.0,(float)local_14,(float)local_18);
  Vec2::set(&this->scale,1.0,1.0);
  p_Var4 = __glewGenFramebuffers;
  pvVar7 = std::vector<BatchT,_std::allocator<BatchT>_>::operator[](&batches,(long)this->objectId);
  (*p_Var4)(1,&pvVar7->framebufferId);
  p_Var2 = __glewBindFramebuffer;
  pvVar7 = std::vector<BatchT,_std::allocator<BatchT>_>::operator[](&batches,(long)this->objectId);
  (*p_Var2)(0x8d40,pvVar7->framebufferId);
  GVar6 = createTexture(local_14,local_18);
  pvVar7 = std::vector<BatchT,_std::allocator<BatchT>_>::operator[](&batches,(long)this->objectId);
  pvVar7->textureId = GVar6;
  p_Var3 = __glewFramebufferTexture2D;
  pvVar7 = std::vector<BatchT,_std::allocator<BatchT>_>::operator[](&batches,(long)this->objectId);
  (*p_Var3)(0x8d40,0x8ce0,0xde1,pvVar7->textureId,0);
  this = (Batch *)(*__glewBindFramebuffer)(0x8d40,0);
LAB_001fcc8d:
  return (int)this;
}

Assistant:

void nite::Batch::init(int w, int h){
	if(objectId >= 0){
		if(w == size.x && h == size.y){
			return;
		}
		unload();
	}
	objectId = getEmptySlot();
	batches[objectId].owners.push_back(this);
	batches[objectId].empty = false;
	size.set(w, h);
	region.set(0, 0, w, h);
	scale.set(1.0f, 1.0f);
	glGenFramebuffers(1, &batches[objectId].framebufferId);
	glBindFramebuffer(GL_FRAMEBUFFER, batches[objectId].framebufferId);
	batches[objectId].textureId = createTexture(w, h);
	glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, batches[objectId].textureId, 0);
	glBindFramebuffer(GL_FRAMEBUFFER, 0);
}